

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_rerate(command_conflict *cmd)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  int local_20;
  wchar_t i;
  wchar_t percent;
  wchar_t max_value;
  wchar_t min_value;
  command_conflict *cmd_local;
  
  bVar1 = player->hitdie;
  bVar2 = player->hitdie;
  player->player_hp[0] = (ushort)player->hitdie;
  do {
    for (local_20 = 1; local_20 < 0x32; local_20 = local_20 + 1) {
      uVar3 = Rand_div((uint)player->hitdie);
      player->player_hp[local_20] = (short)uVar3 + 1;
      player->player_hp[local_20] = player->player_hp[local_20] + player->player_hp[local_20 + -1];
    }
  } while (((int)player->player_hp[0x31] < (int)((bVar1 - 1) * 0x96) / 8 + 0x32) ||
          ((int)((bVar2 - 1) * 0xfa) / 8 + 0x32 < (int)player->player_hp[0x31]));
  lVar4 = (long)player->player_hp[0x31] * 200;
  lVar5 = (long)(int)((uint)player->hitdie + (uint)player->hitdie * 0x31);
  player->upkeep->update = player->upkeep->update | 4;
  player->upkeep->redraw = player->upkeep->redraw | 0x40;
  msg("Current Life Rating is %d/100.",lVar4 / lVar5 & 0xffffffff,lVar4 % lVar5);
  return;
}

Assistant:

void do_cmd_wiz_rerate(struct command *cmd)
{
	int min_value, max_value, percent;

	min_value = (PY_MAX_LEVEL * 3 * (player->hitdie - 1)) / 8;
	min_value += PY_MAX_LEVEL;

	max_value = (PY_MAX_LEVEL * 5 * (player->hitdie - 1)) / 8;
	max_value += PY_MAX_LEVEL;

	player->player_hp[0] = player->hitdie;

	/* Rerate */
	while (1) {
		int i;

		/* Collect values */
		for (i = 1; i < PY_MAX_LEVEL; i++) {
			player->player_hp[i] = randint1(player->hitdie);
			player->player_hp[i] += player->player_hp[i - 1];
		}

		/* Legal values */
		if (player->player_hp[PY_MAX_LEVEL - 1] >= min_value &&
			player->player_hp[PY_MAX_LEVEL - 1] <= max_value) break;
	}

	percent = (int)(((long)player->player_hp[PY_MAX_LEVEL - 1] * 200L) /
		(player->hitdie + ((PY_MAX_LEVEL - 1) * player->hitdie)));

	/* Update and redraw hitpoints */
	player->upkeep->update |= PU_HP;
	player->upkeep->redraw |= PR_HP;

	msg("Current Life Rating is %d/100.", percent);
}